

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O1

void __thiscall smf::Options::reset(Options *this)

{
  Option_register *this_00;
  pointer ppOVar1;
  pointer ppOVar2;
  uint uVar3;
  ulong uVar4;
  
  ppOVar1 = (this->m_optionRegister).
            super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppOVar2 = (this->m_optionRegister).
            super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppOVar2 != ppOVar1) {
    uVar3 = 1;
    uVar4 = 0;
    do {
      this_00 = ppOVar1[uVar4];
      if (this_00 != (Option_register *)0x0) {
        Option_register::~Option_register(this_00);
        operator_delete(this_00);
      }
      (this->m_optionRegister).
      super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] = (Option_register *)0x0;
      uVar4 = (ulong)uVar3;
      ppOVar1 = (this->m_optionRegister).
                super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppOVar2 = (this->m_optionRegister).
                super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      uVar3 = uVar3 + 1;
    } while (uVar4 < (ulong)((long)ppOVar2 - (long)ppOVar1 >> 3));
  }
  if (ppOVar2 != ppOVar1) {
    (this->m_optionRegister).
    super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppOVar1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->m_argument);
  (this->m_commandString)._M_string_length = 0;
  *(this->m_commandString)._M_dataplus._M_p = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->m_extraArgv);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->m_extraArgv_strings);
  this->m_oargc = -1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->m_oargv);
  return;
}

Assistant:

void Options::reset(void) {
	unsigned int i;
	for (i=0; i<m_optionRegister.size(); i++) {
		delete m_optionRegister[i];
		m_optionRegister[i] = NULL;
	}
	m_optionRegister.clear();

	m_argument.clear();
	m_commandString.clear();
	m_extraArgv.clear();
	m_extraArgv_strings.clear();

	m_oargc = -1;
	m_oargv.clear();
}